

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input-xkb.c
# Opt level: O3

uint32_t wpe_input_xkb_context_get_modifiers
                   (wpe_input_xkb_context *xkb_context,uint32_t depressed,uint32_t latched,
                   uint32_t locked,uint32_t group)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  undefined8 uVar7;
  
  wpe_input_xkb_context_try_ensure_keymap(xkb_context);
  if (xkb_context->state == (xkb_state *)0x0) {
    uVar6 = 0;
  }
  else {
    xkb_state_update_mask(xkb_context->state,depressed,latched,locked,0,0,group);
    uVar2 = xkb_state_serialize_mods(xkb_context->state,3);
    uVar7 = xkb_state_get_keymap(xkb_context->state);
    uVar3 = xkb_keymap_mod_get_index(uVar7,"Shift");
    uVar3 = (uint)((uVar2 >> (uVar3 & 0x1f) & 1) != 0);
    uVar4 = xkb_keymap_mod_get_index(uVar7,"Control");
    uVar4 = (uint)((uVar2 >> (uVar4 & 0x1f) & 1) != 0);
    uVar5 = xkb_keymap_mod_get_index(uVar7,"Mod1");
    uVar1 = uVar4 + 4 + uVar3 * 2;
    if ((uVar2 >> (uVar5 & 0x1f) & 1) == 0) {
      uVar1 = uVar4 + uVar3 * 2;
    }
    uVar3 = xkb_keymap_mod_get_index(uVar7,"Meta");
    uVar6 = uVar1 + 8;
    if ((uVar2 >> (uVar3 & 0x1f) & 1) == 0) {
      uVar6 = uVar1;
    }
  }
  return uVar6;
}

Assistant:

uint32_t
wpe_input_xkb_context_get_modifiers(struct wpe_input_xkb_context* xkb_context, uint32_t depressed, uint32_t latched, uint32_t locked, uint32_t group)
{
    wpe_input_xkb_context_try_ensure_keymap(xkb_context);
    if (!xkb_context->state)
        return 0;

    xkb_state_update_mask(xkb_context->state, depressed, latched, locked, 0, 0, group);
    xkb_mod_mask_t mask = xkb_state_serialize_mods(xkb_context->state, XKB_STATE_MODS_DEPRESSED | XKB_STATE_MODS_LATCHED);

    struct xkb_keymap* keymap = xkb_state_get_keymap(xkb_context->state);
    uint32_t retval = 0;
    if (mask & (1 << xkb_keymap_mod_get_index(keymap, XKB_MOD_NAME_SHIFT)))
        retval |= wpe_input_keyboard_modifier_shift;
    if (mask & (1 << xkb_keymap_mod_get_index(keymap, XKB_MOD_NAME_CTRL)))
        retval |= wpe_input_keyboard_modifier_control;
    if (mask & (1 << xkb_keymap_mod_get_index(keymap, XKB_MOD_NAME_ALT)))
        retval |= wpe_input_keyboard_modifier_alt;
    if (mask & (1 << xkb_keymap_mod_get_index(keymap, "Meta")))
        retval |= wpe_input_keyboard_modifier_meta;
    return retval;
}